

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_identity(lysp_yin_ctx *ctx,lysp_ident **identities)

{
  lysp_ident *arg_val;
  LY_ERR ret___3;
  LY_ERR ret___2;
  yin_subelement subelems [6];
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_ident *ident;
  lysp_ident **identities_local;
  lysp_yin_ctx *ctx_local;
  
  if (*identities == (lysp_ident *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x40);
    if (_ret___1 == (undefined8 *)0x0) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_identity");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + 1;
    _ret___1 = (undefined8 *)
               realloc(&(*identities)[-1].flags,*(long *)&(*identities)[-1].flags * 0x38 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_identity");
      return LY_EMEM;
    }
  }
  *identities = (lysp_ident *)(_ret___1 + 1);
  arg_val = *identities + *(long *)&(*identities)[-1].flags + -1;
  memset(arg_val,0,0x38);
  subelems[5]._20_4_ = lyxml_ctx_next(ctx->xmlctx);
  ctx_local._4_4_ = subelems[5]._20_4_;
  if ((subelems[5]._20_4_ == LY_SUCCESS) &&
     (subelems[5]._16_4_ =
           yin_parse_attribute(ctx,YIN_ARG_NAME,&arg_val->name,Y_IDENTIF_ARG,LY_STMT_IDENTITY),
     ctx_local._4_4_ = subelems[5]._16_4_, subelems[5]._16_4_ == LY_SUCCESS)) {
    ret___3 = 0x20000;
    subelems[0]._0_8_ = &arg_val->bases;
    subelems[0].dest._0_2_ = 0;
    subelems[0].flags = 0;
    subelems[0]._18_2_ = 8;
    subelems[1]._0_8_ = &arg_val->dsc;
    subelems[1].dest._0_2_ = 2;
    subelems[1].flags = 0;
    subelems[1]._18_2_ = 0x13;
    subelems[2]._0_8_ = &arg_val->iffeatures;
    subelems[2].dest._0_2_ = 8;
    subelems[2].flags = 0;
    subelems[2]._18_2_ = 0x27;
    subelems[3]._0_8_ = &arg_val->ref;
    subelems[3].dest._0_2_ = 2;
    subelems[3].flags = 0;
    subelems[3]._18_2_ = 0x2c;
    subelems[4]._0_8_ = &arg_val->flags;
    subelems[4].dest._0_2_ = 2;
    memset(&subelems[4].flags,0,0x18);
    subelems[4].flags = 0;
    subelems[4]._18_2_ = 0xf;
    ctx_local._4_4_ =
         yin_parse_content(ctx,(yin_subelement *)&ret___3,6,arg_val,LY_STMT_IDENTITY,(char **)0x0,
                           &arg_val->exts);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ = yin_unres_exts_add(ctx,arg_val->exts), ctx_local._4_4_ == LY_SUCCESS)) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_identity(struct lysp_yin_ctx *ctx, struct lysp_ident **identities)
{
    struct lysp_ident *ident;

    /* allocate new identity */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *identities, ident, LY_EMEM);

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &ident->name, Y_IDENTIF_ARG, LY_STMT_IDENTITY));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_BASE, &ident->bases, 0},
        {LY_STMT_DESCRIPTION, &ident->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &ident->iffeatures, YIN_SUBELEM_VER2},
        {LY_STMT_REFERENCE, &ident->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &ident->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), ident, LY_STMT_IDENTITY, NULL, &ident->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, ident->exts));

    return LY_SUCCESS;
}